

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_BOOLEAN::OAssign(_Type_BOOLEAN *this,Variable *src,Variable *dest)

{
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  bool *pbVar4;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar5;
  Variable local_38;
  Variable *local_28;
  Variable *dest_local;
  Variable *src_local;
  _Type_BOOLEAN *this_local;
  
  local_28 = in_RCX;
  dest_local = dest;
  src_local = src;
  this_local = this;
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)src);
  if (bVar1) {
    pOVar2 = Variable::operator->(local_28);
    pTVar3 = Object::GetType(pOVar2);
    pOVar2 = Variable::operator*(dest_local);
    (*pTVar3->_vptr_Type[1])(pTVar3,pOVar2);
    pOVar2 = Variable::operator->(dest_local);
    pTVar3 = Object::GetType(pOVar2);
    (*pTVar3->_vptr_Type[3])(&local_38,pTVar3,dest_local,local_28);
    Variable::~Variable(&local_38);
  }
  else {
    pOVar2 = Variable::operator->(local_28);
    pbVar4 = Object::GetData<bool>(pOVar2);
    bVar1 = *pbVar4;
    pOVar2 = Variable::operator->(dest_local);
    pbVar4 = Object::GetData<bool>(pOVar2);
    *pbVar4 = (bool)(bVar1 & 1);
  }
  Variable::Variable((Variable *)this,dest_local);
  VVar5.nb_ref = extraout_RDX;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::_Type_BOOLEAN::OAssign(LiteScript::Variable& src, const LiteScript::Variable& dest) const {
    if (dest->GetType() != *this) {
        dest->GetType().AssignObject(*src);
        src->GetType().OAssign(src, dest);
    }
    else {
        src->GetData<bool>() = dest->GetData<bool>();
    }
    return Variable(src);
}